

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

Ptr priExpress(TokenReader *tokens)

{
  bool bVar1;
  invalid_argument *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ptr PVar4;
  Token local_f8;
  shared_ptr<SimpleASTNode> local_d0;
  Token local_c0;
  int local_94;
  shared_ptr<SimpleASTNode> local_90;
  Token local_80;
  undefined1 local_48 [8];
  Token token;
  TokenReader *tokens_local;
  Ptr *node;
  
  token._39_1_ = 0;
  std::shared_ptr<SimpleASTNode>::shared_ptr((shared_ptr<SimpleASTNode> *)tokens,(nullptr_t)0x0);
  TokenReader::peek();
  bVar1 = Token::isEmpty((Token *)local_48);
  if (bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"Invalid arguments, valid variable or literal is required!");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((local_48._0_4_ == ID_TYPE) || (local_48._0_4_ == INT_LITERAL_TYPE)) {
    TokenReader::read();
    Token::operator=((Token *)local_48,&local_80);
    Token::~Token(&local_80);
    local_94 = (local_48._0_4_ == ID_TYPE) + 1;
    SimpleASTNode::create((ASTNodeType *)&local_90,(string *)&local_94);
    std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)tokens,&local_90);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_90);
  }
  else {
    if (local_48._0_4_ != LBRACKET_TYPE) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar2,"Invalid arguments, valid variable or literal is required!");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    TokenReader::read();
    Token::operator=((Token *)local_48,&local_c0);
    Token::~Token(&local_c0);
    express((TokenReader *)&local_d0);
    std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)tokens,&local_d0);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_d0);
    TokenReader::read();
    Token::operator=((Token *)local_48,&local_f8);
    Token::~Token(&local_f8);
    bVar1 = Token::isEmpty((Token *)local_48);
    if ((bVar1) || (local_48._0_4_ != RBRACKET_TYPE)) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"Lack of right bracket \")\"");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  token._39_1_ = 1;
  Token::~Token((Token *)local_48);
  _Var3._M_pi = extraout_RDX;
  if ((token._39_1_ & 1) == 0) {
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)tokens);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tokens;
  return (Ptr)PVar4.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr priExpress(TokenReader& tokens)
{
    //std::cout << "in pri express" << std::endl;
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    //std::cout << "token type " << token.type << std::endl;
    if (!token.isEmpty()) {
        if (token.type == TokenType::ID_TYPE || token.type == TokenType::INT_LITERAL_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create((token.type == TokenType::ID_TYPE) ? ASTNodeType::ID :
                   ASTNodeType::INT_LITERAL,  token.val);
        } else if (token.type == TokenType::LBRACKET_TYPE) {
            token = tokens.read();
            node = express(tokens);
            token = tokens.read(); // consume the ")"
            if (token.isEmpty() || token.type != TokenType::RBRACKET_TYPE)
                throw std::invalid_argument("Lack of right bracket \")\"");
        } else {
            throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
        }
    } else {
        throw std::invalid_argument("Invalid arguments, valid variable or literal is required!");
    }
    return node;
}